

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::SupportVectorRegressor::SharedDtor(SupportVectorRegressor *this)

{
  bool bVar1;
  SupportVectorRegressor *pSVar2;
  SupportVectorRegressor *this_local;
  
  pSVar2 = internal_default_instance();
  if ((this != pSVar2) && (this->kernel_ != (Kernel *)0x0)) {
    (*(this->kernel_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pSVar2 = internal_default_instance();
  if ((this != pSVar2) && (this->coefficients_ != (Coefficients *)0x0)) {
    (*(this->coefficients_->super_MessageLite)._vptr_MessageLite[1])();
  }
  bVar1 = has_supportVectors(this);
  if (bVar1) {
    clear_supportVectors(this);
  }
  return;
}

Assistant:

void SupportVectorRegressor::SharedDtor() {
  if (this != internal_default_instance()) {
    delete kernel_;
  }
  if (this != internal_default_instance()) {
    delete coefficients_;
  }
  if (has_supportVectors()) {
    clear_supportVectors();
  }
}